

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O3

bool __thiscall
Kernel::InterpretedLiteralEvaluator::RatEvaluator::tryEvaluateUnaryFunc
          (RatEvaluator *this,Interpretation op,Value *arg,Value *res)

{
  double in_XMM0_Qa;
  RationalConstantType local_60;
  __mpz_struct local_40;
  RationalConstantType local_30;
  
  if ((int)op < 0x33) {
    if (op == RAT_UNARY_MINUS) {
      RationalConstantType::operator-(&local_60,arg);
      mpz_swap((__mpz_struct *)res,(__mpz_struct *)&local_60);
      mpz_swap((res->_den)._val,local_60._den._val);
      mpz_clear(local_60._den._val);
      mpz_clear((__mpz_struct *)&local_60);
    }
    else {
      if (op != RAT_FLOOR) {
        return false;
      }
      RationalConstantType::floor((RationalConstantType *)&local_30._den,in_XMM0_Qa);
      RationalConstantType::RationalConstantType(&local_60,&local_30._den);
      mpz_swap((__mpz_struct *)res,(__mpz_struct *)&local_60);
      mpz_swap((res->_den)._val,local_60._den._val);
      mpz_clear(local_60._den._val);
      mpz_clear((__mpz_struct *)&local_60);
      mpz_clear(local_30._den._val);
    }
  }
  else if (op == RAT_CEILING) {
    RationalConstantType::ceiling(&local_30);
    RationalConstantType::RationalConstantType(&local_60,&local_30._num);
    mpz_swap((__mpz_struct *)res,(__mpz_struct *)&local_60);
    mpz_swap((res->_den)._val,local_60._den._val);
    mpz_clear(local_60._den._val);
    mpz_clear((__mpz_struct *)&local_60);
    mpz_clear((__mpz_struct *)&local_30);
  }
  else {
    if (op != RAT_TRUNCATE) {
      return false;
    }
    IntegerConstantType::quotientT<Kernel::IntegerConstantType>
              ((IntegerConstantType *)&local_40,&arg->_num);
    RationalConstantType::RationalConstantType(&local_60,(IntegerConstantType *)&local_40);
    mpz_swap((__mpz_struct *)res,(__mpz_struct *)&local_60);
    mpz_swap((res->_den)._val,local_60._den._val);
    mpz_clear(local_60._den._val);
    mpz_clear((__mpz_struct *)&local_60);
    mpz_clear(&local_40);
  }
  return true;
}

Assistant:

virtual bool tryEvaluateUnaryFunc(Interpretation op, const Value& arg, Value& res)
  {
    switch(op) {
    case Theory::RAT_UNARY_MINUS:
      res = -arg;
      return true;
    case Theory::RAT_FLOOR:
      res = RationalConstantType(arg.floor());
      return true;
    case Theory::RAT_CEILING:
      res = RationalConstantType(arg.ceiling());
      return true;
    case Theory::RAT_TRUNCATE:
      res = RationalConstantType(arg.truncate());
      return true;
    default:
      return false;
    }
  }